

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManFindDerive(Gia_Man_t *pNew,int nOuts,Vec_Int_t *vIns,Vec_Wec_t *vCofs,Vec_Int_t *vMap)

{
  uint uVar1;
  uint nVars;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vMemory;
  int *piVar6;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong *pTruth;
  uint uVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  void *local_88;
  
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vMemory->pArray = piVar6;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  uVar1 = vCofs->nSize;
  uVar10 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar10 = uVar1;
  }
  if ((uVar10 == 0) || (local_88 = malloc((long)(int)uVar10 * 4), local_88 == (void *)0x0)) {
    local_88 = (void *)0x0;
  }
  else {
    memset(local_88,0,(long)(int)uVar1 * 4);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_00->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nSize = 0;
  p_01->nCap = uVar10;
  if (uVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar10 << 2);
  }
  p_01->pArray = piVar6;
  iVar4 = vIns->nSize;
  uVar10 = 1 << ((byte)iVar4 - 6 & 0x1f);
  if (iVar4 < 7) {
    uVar10 = 1;
  }
  pTruth = (ulong *)malloc((long)(int)uVar10 << 3);
  uVar13 = vMap->nSize;
  uVar17 = 0;
  if ((ulong)uVar13 != 0) {
    uVar17 = *vMap->pArray;
    if (1 < (int)uVar13) {
      uVar12 = 1;
      do {
        uVar11 = vMap->pArray[uVar12];
        if ((int)uVar17 <= (int)uVar11) {
          uVar17 = uVar11;
        }
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
  }
  uVar11 = 0x1f;
  if (uVar17 != 0) {
    for (; uVar17 >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  uVar11 = (uVar11 ^ 0xffffffe0) + 0x21;
  if (uVar17 + 1 < 2) {
    uVar11 = uVar17 + 1;
  }
  if (iVar4 <= (int)uVar11) {
    __assert_fail("nBits < Vec_IntSize(vIns)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44c,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (uVar13 != uVar1) {
    __assert_fail("Vec_IntSize(vMap) == Vec_WecSize(vCofs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44d,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (uVar1 != 1 << ((byte)iVar4 & 0x1f)) {
    __assert_fail("Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x44e,
                  "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
    ;
  }
  if (0 < iVar4) {
    lVar14 = 0;
    do {
      iVar4 = vIns->pArray[lVar14];
      if (((long)iVar4 < 0) || (pNew->vCis->nSize <= iVar4)) {
LAB_00222b58:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pNew->vCis->pArray[iVar4];
      if (((long)iVar4 < 0) || (pNew->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pNew->pObjs;
      pGVar9 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar4) & 0xfffffffffffffffe);
      if ((pGVar9 < pGVar2) || (pGVar2 + (uint)pNew->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = (int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2);
      if (iVar5 * -0x55555555 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p,((uint)(pGVar2 + iVar4) & 1) + iVar5 * 0x55555556);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vIns->nSize);
  }
  if (0 < (int)uVar11) {
    uVar13 = 0;
    do {
      if (0 < (int)uVar10) {
        memset(pTruth,0,(ulong)uVar10 << 3);
      }
      iVar4 = vMap->nSize;
      if (0 < (long)iVar4) {
        piVar6 = vMap->pArray;
        uVar12 = 0;
        do {
          if ((piVar6[uVar12] & 1 << ((byte)uVar13 & 0x1f)) != 0) {
            pTruth[uVar12 >> 6 & 0x3ffffff] =
                 pTruth[uVar12 >> 6 & 0x3ffffff] | 1L << ((byte)uVar12 & 0x3f);
          }
          uVar12 = uVar12 + 1;
        } while ((long)iVar4 != uVar12);
      }
      nVars = vIns->nSize;
      if (uVar11 < 6) {
        if ((int)nVars < 0) {
          __assert_fail("nVars >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x489,"word Abc_Tt6Stretch(word, int)");
        }
        uVar15 = nVars;
        if (nVars < 3) {
          uVar15 = 3;
        }
        uVar7 = uVar15;
        if (uVar15 == 3) {
          uVar7 = 4;
        }
        uVar3 = uVar7;
        if (uVar7 == 4) {
          uVar3 = 5;
        }
        if (1 < uVar3 - 5) {
          __assert_fail("nVars == 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x496,"word Abc_Tt6Stretch(word, int)");
        }
        uVar16 = (uint)*pTruth;
        uVar18 = -(uVar16 & 1);
        if (nVars != 0) {
          uVar18 = uVar16;
        }
        uVar18 = (uVar18 & 3) * 5;
        if (1 < nVars) {
          uVar18 = uVar16;
        }
        uVar12 = (ulong)((uVar18 & 0xf) << 4 | uVar18 & 0xf);
        if (2 < nVars) {
          uVar12 = *pTruth;
        }
        uVar20 = (ulong)(uint)((int)(uVar12 & 0xff) << 8) | uVar12 & 0xff;
        if (uVar15 != 3) {
          uVar20 = uVar12;
        }
        uVar12 = (ulong)(uint)((int)uVar20 << 0x10) | uVar20 & 0xffff;
        if (uVar7 != 4) {
          uVar12 = uVar20;
        }
        uVar20 = uVar12 << 0x20 | uVar12 & 0xffffffff;
        if (uVar3 != 5) {
          uVar20 = uVar12;
        }
        *pTruth = uVar20;
      }
      iVar4 = Kit_TruthToGia(pNew,(uint *)pTruth,nVars,vMemory,p,1);
      Vec_IntPush(p_00,iVar4);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  if (-1 < (int)uVar17) {
    uVar10 = vMap->nSize;
    uVar13 = 0;
    do {
      if ((int)uVar10 < 1) {
LAB_00222b77:
        __assert_fail("Cof >= 0 && Cof < Vec_WecSize(vCofs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x45f,
                      "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      uVar12 = 0;
      while (vMap->pArray[uVar12] != uVar13) {
        uVar12 = uVar12 + 1;
        if (uVar10 == uVar12) goto LAB_00222b77;
      }
      if (vCofs->nSize <= (int)uVar12) goto LAB_00222b77;
      if ((int)uVar1 <= (int)uVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)local_88 + uVar12 * 4) = 1;
      bVar21 = uVar13 != uVar17;
      uVar13 = uVar13 + 1;
    } while (bVar21);
  }
  if (0 < nOuts) {
    iVar4 = 1 << ((byte)uVar11 & 0x1f);
    uVar20 = 0;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar12 = uVar20;
    }
    do {
      p_01->nSize = 0;
      iVar5 = vCofs->nSize;
      iVar8 = 0;
      if (0 < iVar5) {
        lVar14 = 8;
        uVar19 = 0;
        do {
          if (uVar12 == uVar19) goto LAB_00222b58;
          if (*(int *)((long)local_88 + uVar19 * 4) != 0) {
            if ((long)*(int *)((long)vCofs->pArray + lVar14 + -4) <= (long)uVar20)
            goto LAB_00222b58;
            Vec_IntPush(p_01,*(int *)(*(long *)((long)&vCofs->pArray->nCap + lVar14) + uVar20 * 4));
            iVar5 = vCofs->nSize;
          }
          uVar19 = uVar19 + 1;
          lVar14 = lVar14 + 0x10;
        } while ((long)uVar19 < (long)iVar5);
        iVar8 = p_01->nSize;
      }
      while (iVar8 < iVar4) {
        Vec_IntPush(p_01,0);
        iVar8 = p_01->nSize;
      }
      if (iVar8 != iVar4) {
        __assert_fail("Vec_IntSize(vData) == (1 << nBits)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x46b,
                      "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      if (p_00->nSize != uVar11) {
        __assert_fail("Vec_IntSize(vBits) == nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                      ,0x46c,
                      "void Gia_ManFindDerive(Gia_Man_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)"
                     );
      }
      iVar5 = Gia_ManFindMuxTree_rec(pNew,p_00->pArray,uVar11,p_01,0);
      Gia_ManAppendCo(pNew,iVar5);
      uVar20 = uVar20 + 1;
    } while (uVar20 != (uint)nOuts);
  }
  if (pTruth != (ulong *)0x0) {
    free(pTruth);
  }
  if (local_88 != (void *)0x0) {
    free(local_88);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  return;
}

Assistant:

void Gia_ManFindDerive( Gia_Man_t * pNew, int nOuts, Vec_Int_t * vIns, Vec_Wec_t * vCofs, Vec_Int_t * vMap )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves = Vec_IntAlloc( 100 );
    Vec_Int_t * vUsed = Vec_IntStart( Vec_WecSize(vCofs) );
    Vec_Int_t * vBits = Vec_IntAlloc( 10 );
    Vec_Int_t * vData = Vec_IntAlloc( Vec_WecSize(vCofs) );
    int nWords = Abc_TtWordNum(Vec_IntSize(vIns));
    word * pTruth = ABC_ALLOC( word, nWords );
    int nValues = Vec_IntFindMax(vMap)+1;
    int i, k, Value, nBits = Abc_Base2Log(nValues);
    assert( nBits < Vec_IntSize(vIns) );
    assert( Vec_IntSize(vMap) == Vec_WecSize(vCofs) );
    assert( Vec_IntSize(vMap) == (1 << Vec_IntSize(vIns)) );
    Vec_IntForEachEntry( vIns, Value, i )
        Vec_IntPush( vLeaves, Gia_ObjToLit(pNew, Gia_ManCi(pNew, Value)) );
    for ( i = 0; i < nBits; i++ )
    {
        Abc_TtClear( pTruth, nWords );
        Vec_IntForEachEntry( vMap, Value, k )
            if ( (Value >> i) & 1 )
                Abc_TtSetBit( pTruth, k );
        if ( nBits < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], Vec_IntSize(vIns) );
        Vec_IntPush( vBits, Kit_TruthToGia(pNew, (unsigned*)pTruth, Vec_IntSize(vIns), vMemory, vLeaves, 1) );
        //printf( "Bit %d : ", i ); Dau_DsdPrintFromTruth( pTruth, Vec_IntSize(vIns) );
    }
    for ( i = 0; i < nValues; i++ )
    {
        int Cof = Vec_IntFind(vMap, i);
        assert( Cof >= 0 && Cof < Vec_WecSize(vCofs) );
        Vec_IntWriteEntry( vUsed, Cof, 1 );
    }
    for ( i = 0; i < nOuts; i++ )
    {
        Vec_Int_t * vLevel;
        Vec_IntClear( vData );
        Vec_WecForEachLevel( vCofs, vLevel, k )
            if ( Vec_IntEntry(vUsed, k) )
                Vec_IntPush( vData, Vec_IntEntry(vLevel, i) );
        while ( Vec_IntSize(vData) < (1 << nBits) )
            Vec_IntPush( vData, 0 );
        assert( Vec_IntSize(vData) == (1 << nBits) );
        assert( Vec_IntSize(vBits) == nBits );
        Value = Gia_ManFindMuxTree_rec( pNew, Vec_IntArray(vBits), Vec_IntSize(vBits), vData, 0 );
        Gia_ManAppendCo( pNew, Value );
    }
    ABC_FREE( pTruth );
    Vec_IntFree( vUsed );
    Vec_IntFree( vBits );
    Vec_IntFree( vData );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vMemory );
}